

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  wchar_t wVar4;
  archive_string_conv *paVar5;
  undefined4 *puVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  archive_entry *entry_00;
  long lVar10;
  time_t tVar11;
  uint64_t uVar12;
  void *pvVar13;
  size_t sVar14;
  int *piVar15;
  char *pcVar16;
  char in_DL;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  archive_entry *in_RSI;
  archive *in_RDI;
  uint cp;
  uint8_t length;
  char high;
  char extra;
  uint offset;
  uint fn_end;
  uchar flagbyte;
  uchar flagbits;
  uchar highbyte;
  size_t newsize;
  char *newptr;
  size_t distance;
  int ret2;
  int ret;
  unsigned_long crc32_val;
  archive_string_conv *fn_sconv;
  archive_string_conv *sconv;
  int ttime;
  char unp_size [8];
  char packed_size [8];
  char *strp;
  char *filename;
  uint end;
  uint filename_size;
  int64_t header_size;
  rar_file_header file_header;
  rar_header rar_header;
  rar *rar;
  char *endp;
  char *p;
  void *h;
  archive_string_conv *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  wchar_t in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  archive_string_conv *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  char local_df;
  undefined1 local_de;
  char local_dd;
  int in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  byte in_stack_ffffffffffffff2d;
  byte in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  rar *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  int local_b4;
  archive_string_conv *local_a8;
  archive_string_conv *local_a0;
  short *local_80;
  uint local_6c;
  ulong local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_47 [3];
  long lVar21;
  undefined8 *local_38;
  undefined8 *local_30;
  int local_4;
  
  local_b4 = 0;
  lVar21 = *(long *)in_RDI[0x15].archive_format_name;
  local_a0 = *(archive_string_conv **)(lVar21 + 0x4eb0);
  if (local_a0 == (archive_string_conv *)0x0) {
    if (*(int *)(lVar21 + 0x4ea0) == 0) {
      paVar5 = archive_string_default_conversion_for_read(in_RDI);
      *(archive_string_conv **)(lVar21 + 0x4ea8) = paVar5;
      *(undefined4 *)(lVar21 + 0x4ea0) = 1;
    }
    local_a0 = *(archive_string_conv **)(lVar21 + 0x4ea8);
  }
  puVar6 = (undefined4 *)
           __archive_read_ahead
                     ((archive_read *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (size_t)in_stack_fffffffffffffee8,(ssize_t *)0x1479da);
  if (puVar6 == (undefined4 *)0x0) {
    local_4 = -0x1e;
  }
  else {
    _local_47 = *puVar6;
    uVar1 = archive_le16dec(&stack0xffffffffffffffbc);
    *(uint *)(lVar21 + 0x18) = (uint)uVar1;
    uVar1 = archive_le16dec(&stack0xffffffffffffffbe);
    local_68 = (ulong)uVar1;
    if (local_68 < 0x20) {
      archive_set_error(in_RDI,0x54,"Invalid header size");
      local_4 = -0x1e;
    }
    else {
      uVar7 = crc32(0,(long)puVar6 + 2,5);
      __archive_read_consume
                ((archive_read *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (int64_t)in_stack_fffffffffffffee8);
      if ((*(uint *)(lVar21 + 0x18) & 0x10) == 0) {
        *(undefined1 *)(lVar21 + 0x17) = 0;
        *(undefined8 *)(lVar21 + 0x20) = 0;
        *(undefined8 *)(lVar21 + 0x28) = 0;
        *(undefined8 *)(lVar21 + 0x30) = 0;
        *(undefined8 *)(lVar21 + 0x78) = 0;
        *(undefined8 *)(lVar21 + 0x68) = 0;
        *(undefined8 *)(lVar21 + 0x88) = 0;
        *(undefined4 *)(lVar21 + 0x40) = 0;
        memset((void *)(lVar21 + 0x60),0,8);
        *(undefined8 *)(lVar21 + 0x68) = 0;
        *(undefined8 *)(lVar21 + 0x70) = 0;
        *(undefined8 *)(lVar21 + 0x78) = 0;
        *(undefined8 *)(lVar21 + 0x80) = 0;
        *(undefined8 *)(lVar21 + 0x30) = 0;
        *(undefined8 *)(lVar21 + 0x38) = 0;
        *(undefined8 *)(lVar21 + 0x88) = 0;
        *(undefined8 *)(lVar21 + 0x90) = 0;
        puVar8 = (undefined8 *)
                 __archive_read_ahead
                           ((archive_read *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (size_t)in_stack_fffffffffffffee8,(ssize_t *)0x147c51);
        if (puVar8 == (undefined8 *)0x0) {
          local_4 = -0x1e;
        }
        else {
          uVar9 = crc32(uVar7,puVar8,uVar1 - 7);
          entry_00 = (archive_entry *)(uVar9 & 0xffff);
          uVar1 = archive_le16dec(local_47);
          if (entry_00 == (archive_entry *)(ulong)uVar1) {
            lVar10 = (long)puVar8 + local_68;
            local_60 = *puVar8;
            local_58 = puVar8[1];
            local_30 = (undefined8 *)((long)puVar8 + 0x19);
            *(char *)(lVar21 + 0x17) = (char)((ulong)puVar8[2] >> 0x10);
            archive_le32dec((void *)((long)&local_58 + 5));
            tVar11 = get_time(in_stack_ffffffffffffff24);
            *(time_t *)(lVar21 + 0x30) = tVar11;
            uVar2 = archive_le32dec((void *)((long)&local_58 + 1));
            *(ulong *)(lVar21 + 8) = (ulong)uVar2;
            if ((*(uint *)(lVar21 + 0x18) & 4) != 0) {
              archive_entry_set_is_data_encrypted(in_RSI,'\x01');
              *(undefined4 *)(lVar21 + 0x4ee8) = 1;
              archive_set_error(in_RDI,0x54,"RAR encryption support unavailable.");
            }
            if ((*(uint *)(lVar21 + 0x18) & 0x100) == 0) {
              uVar2 = archive_le32dec(&local_60);
              *(ulong *)(lVar21 + 0x20) = (ulong)uVar2;
              uVar2 = archive_le32dec((void *)((long)&local_60 + 4));
              *(ulong *)(lVar21 + 0x28) = (ulong)uVar2;
            }
            else {
              local_30 = (undefined8 *)((long)puVar8 + 0x21);
              uVar12 = archive_le64dec((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                        in_stack_fffffffffffffef0));
              *(uint64_t *)(lVar21 + 0x20) = uVar12;
              uVar12 = archive_le64dec((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                        in_stack_fffffffffffffef0));
              *(uint64_t *)(lVar21 + 0x28) = uVar12;
            }
            if ((*(long *)(lVar21 + 0x20) < 0) || (*(long *)(lVar21 + 0x28) < 0)) {
              archive_set_error(in_RDI,0x54,"Invalid sizes specified.");
              local_4 = -0x1e;
            }
            else {
              *(undefined8 *)(lVar21 + 0xa0) = *(undefined8 *)(lVar21 + 0x20);
              if (in_DL == 'z') {
                local_68 = *(long *)(lVar21 + 0x20) + local_68;
                pvVar13 = __archive_read_ahead
                                    ((archive_read *)
                                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                     (size_t)in_stack_fffffffffffffee8,(ssize_t *)0x147fd6);
                if (pvVar13 == (void *)0x0) {
                  return -0x1e;
                }
                lVar10 = (long)pvVar13 + local_68;
                local_30 = (undefined8 *)(((long)local_30 - (long)puVar8) + (long)pvVar13);
              }
              local_38 = (undefined8 *)(lVar10 + -7);
              uVar1 = archive_le16dec(&stack0xffffffffffffffb3);
              uVar19 = (uint)uVar1;
              if (local_38 < (undefined8 *)((long)local_30 + (ulong)uVar19)) {
                archive_set_error(in_RDI,0x54,"Invalid filename size");
                local_4 = -0x1e;
              }
              else {
                if (*(ulong *)(lVar21 + 0x58) < (ulong)(uVar19 * 2 + 2)) {
                  in_stack_ffffffffffffff30 = (rar *)(ulong)(uVar19 * 2 + 2);
                  in_stack_ffffffffffffff38 =
                       (char *)realloc(*(void **)(lVar21 + 0x48),(size_t)in_stack_ffffffffffffff30);
                  if (in_stack_ffffffffffffff38 == (char *)0x0) {
                    archive_set_error(in_RDI,0xc,"Couldn\'t allocate memory.");
                    return -0x1e;
                  }
                  *(char **)(lVar21 + 0x48) = in_stack_ffffffffffffff38;
                  *(rar **)(lVar21 + 0x58) = in_stack_ffffffffffffff30;
                }
                local_80 = *(short **)(lVar21 + 0x48);
                memcpy(local_80,local_30,(ulong)uVar19);
                *(undefined1 *)((long)local_80 + (ulong)uVar19) = 0;
                uVar18 = uVar19;
                local_6c = uVar19;
                if ((*(uint *)(lVar21 + 0x18) & 0x200) == 0) {
                  local_a8 = local_a0;
                  while (pcVar16 = strchr((char *)local_80,0x5c), pcVar16 != (char *)0x0) {
                    *pcVar16 = '/';
                  }
                }
                else {
                  in_stack_ffffffffffffff08 = (archive_string_conv *)(ulong)uVar19;
                  paVar5 = (archive_string_conv *)strlen((char *)local_80);
                  if (in_stack_ffffffffffffff08 == paVar5) {
                    if (*(long *)(lVar21 + 0x4eb8) == 0) {
                      paVar5 = archive_string_conversion_from_charset
                                         ((archive *)
                                          CONCAT17(in_stack_ffffffffffffff07,
                                                   in_stack_ffffffffffffff00),
                                          in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
                      *(archive_string_conv **)(lVar21 + 0x4eb8) = paVar5;
                      if (*(long *)(lVar21 + 0x4eb8) == 0) {
                        return -0x1e;
                      }
                    }
                    local_a8 = *(archive_string_conv **)(lVar21 + 0x4eb8);
                    while (pcVar16 = strchr((char *)local_80,0x5c), pcVar16 != (char *)0x0) {
                      *pcVar16 = '/';
                    }
                  }
                  else {
                    in_stack_ffffffffffffff28 = uVar19 << 1;
                    local_6c = 0;
                    sVar14 = strlen((char *)local_80);
                    in_stack_ffffffffffffff2f =
                         *(undefined1 *)((long)local_30 + (ulong)((int)sVar14 + 1));
                    in_stack_ffffffffffffff2e = 0;
                    in_stack_ffffffffffffff2d = 0;
                    uVar18 = (int)sVar14 + 2;
                    while (in_stack_ffffffffffffff07 =
                                uVar18 < uVar19 && local_6c < in_stack_ffffffffffffff28,
                          uVar18 < uVar19 && local_6c < in_stack_ffffffffffffff28) {
                      uVar17 = uVar18;
                      if (in_stack_ffffffffffffff2e == 0) {
                        uVar17 = uVar18 + 1;
                        in_stack_ffffffffffffff2d = *(byte *)((long)local_30 + (ulong)uVar18);
                        in_stack_ffffffffffffff2e = 8;
                      }
                      in_stack_ffffffffffffff2e = in_stack_ffffffffffffff2e - 2;
                      in_stack_fffffffffffffef8 =
                           (char *)(ulong)(in_stack_ffffffffffffff2d >>
                                           (in_stack_ffffffffffffff2e & 0x1f) & 3);
                      uVar18 = uVar17;
                      switch(in_stack_fffffffffffffef8) {
                      case (char *)0x0:
                        uVar20 = local_6c + 1;
                        *(undefined1 *)((long)local_80 + (ulong)local_6c) = 0;
                        uVar18 = uVar17 + 1;
                        local_6c = local_6c + 2;
                        *(undefined1 *)((long)local_80 + (ulong)uVar20) =
                             *(undefined1 *)((long)local_30 + (ulong)uVar17);
                        break;
                      case (char *)0x1:
                        uVar20 = local_6c + 1;
                        *(undefined1 *)((long)local_80 + (ulong)local_6c) =
                             in_stack_ffffffffffffff2f;
                        uVar18 = uVar17 + 1;
                        local_6c = local_6c + 2;
                        *(undefined1 *)((long)local_80 + (ulong)uVar20) =
                             *(undefined1 *)((long)local_30 + (ulong)uVar17);
                        break;
                      case (char *)0x2:
                        uVar18 = local_6c + 1;
                        *(undefined1 *)((long)local_80 + (ulong)local_6c) =
                             *(undefined1 *)((long)local_30 + (ulong)uVar17 + 1);
                        local_6c = local_6c + 2;
                        *(undefined1 *)((long)local_80 + (ulong)uVar18) =
                             *(undefined1 *)((long)local_30 + (ulong)uVar17);
                        uVar18 = uVar17 + 2;
                        break;
                      case (char *)0x3:
                        uVar18 = uVar17 + 1;
                        if ((*(byte *)((long)local_30 + (ulong)uVar17) & 0x80) == 0) {
                          local_de = 0;
                          local_dd = '\0';
                        }
                        else {
                          local_dd = *(char *)((long)local_30 + (ulong)uVar18);
                          local_de = in_stack_ffffffffffffff2f;
                          uVar18 = uVar17 + 2;
                        }
                        local_df = (*(byte *)((long)local_30 + (ulong)uVar17) & 0x7f) + 2;
                        wVar4 = in_stack_fffffffffffffef4;
                        while( true ) {
                          in_stack_fffffffffffffef4 = wVar4 & 0xffffff;
                          if (local_df != '\0') {
                            in_stack_fffffffffffffef4 =
                                 CONCAT13(local_6c < in_stack_ffffffffffffff28,(int3)wVar4);
                          }
                          if ((char)((uint)in_stack_fffffffffffffef4 >> 0x18) == '\0') break;
                          in_stack_ffffffffffffff1c = local_6c >> 1;
                          uVar17 = local_6c + 1;
                          *(undefined1 *)((long)local_80 + (ulong)local_6c) = local_de;
                          local_6c = local_6c + 2;
                          *(char *)((long)local_80 + (ulong)uVar17) =
                               *(char *)((long)local_30 + (ulong)in_stack_ffffffffffffff1c) +
                               local_dd;
                          local_df = local_df + -1;
                          wVar4 = in_stack_fffffffffffffef4;
                        }
                      }
                    }
                    if (in_stack_ffffffffffffff28 < local_6c) {
                      archive_set_error(in_RDI,0x54,"Invalid filename");
                      return -0x1e;
                    }
                    uVar19 = local_6c + 1;
                    *(undefined1 *)((long)local_80 + (ulong)local_6c) = 0;
                    local_6c = local_6c + 2;
                    *(undefined1 *)((long)local_80 + (ulong)uVar19) = 0;
                    if (*(long *)(lVar21 + 0x4ec0) == 0) {
                      paVar5 = archive_string_conversion_from_charset
                                         ((archive *)
                                          CONCAT17(in_stack_ffffffffffffff07,
                                                   in_stack_ffffffffffffff00),
                                          in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
                      *(archive_string_conv **)(lVar21 + 0x4ec0) = paVar5;
                      if (*(long *)(lVar21 + 0x4ec0) == 0) {
                        return -0x1e;
                      }
                    }
                    local_a8 = *(archive_string_conv **)(lVar21 + 0x4ec0);
                    for (; *local_80 != 0; local_80 = local_80 + 1) {
                      if (*local_80 == 0x5c00) {
                        *(undefined1 *)((long)local_80 + 1) = 0x2f;
                      }
                    }
                  }
                }
                local_30 = (undefined8 *)((long)local_30 + (ulong)uVar18);
                if ((*(long *)(lVar21 + 0x50) == 0) ||
                   (iVar3 = memcmp(*(void **)(lVar21 + 0x48),*(void **)(lVar21 + 0x50),
                                   (ulong)(local_6c + 1)), iVar3 != 0)) {
                  pvVar13 = realloc(*(void **)(lVar21 + 0x50),(ulong)(local_6c + 1));
                  *(void **)(lVar21 + 0x50) = pvVar13;
                  memcpy(*(void **)(lVar21 + 0x50),*(void **)(lVar21 + 0x48),(ulong)(local_6c + 1));
                  free(*(void **)(lVar21 + 0xf8));
                  pvVar13 = calloc(1,0x18);
                  *(void **)(lVar21 + 0xf8) = pvVar13;
                  if (pvVar13 == (void *)0x0) {
                    archive_set_error(in_RDI,0xc,"Couldn\'t allocate memory.");
                    local_4 = -0x1e;
                  }
                  else {
                    **(ulong **)(lVar21 + 0xf8) = local_68;
                    *(undefined8 *)(*(long *)(lVar21 + 0xf8) + 8) = 0xffffffffffffffff;
                    *(undefined8 *)(*(long *)(lVar21 + 0xf8) + 0x10) = 0xffffffffffffffff;
                    *(undefined4 *)(lVar21 + 0x100) = 0;
                    *(undefined4 *)(lVar21 + 0x104) = 1;
                    if ((*(uint *)(lVar21 + 0x18) & 0x400) != 0) {
                      if (local_38 < local_30 + 1) {
                        archive_set_error(in_RDI,0x54,"Invalid header size");
                        return -0x1e;
                      }
                      *(undefined8 *)(lVar21 + 0x60) = *local_30;
                    }
                    if (((*(uint *)(lVar21 + 0x18) & 0x1000) == 0) ||
                       (iVar3 = read_exttime(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                             (char *)CONCAT17(in_stack_ffffffffffffff2f,
                                                              CONCAT16(in_stack_ffffffffffffff2e,
                                                                       CONCAT15(
                                                  in_stack_ffffffffffffff2d,
                                                  CONCAT14(in_stack_ffffffffffffff2c,
                                                           in_stack_ffffffffffffff28))))),
                       -1 < iVar3)) {
                      __archive_read_consume
                                ((archive_read *)
                                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                 (int64_t)in_stack_fffffffffffffee8);
                      *(undefined8 *)(*(long *)(lVar21 + 0xf8) + 8) =
                           *(undefined8 *)in_RDI[8].compression_name;
                      *(long *)(*(long *)(lVar21 + 0xf8) + 0x10) =
                           *(long *)(*(long *)(lVar21 + 0xf8) + 8) + *(long *)(lVar21 + 0x20);
                      uVar19 = (uint)(char)local_58;
                      if (uVar19 < 3) {
                        uVar2 = archive_le32dec(&stack0xffffffffffffffb5);
                        *(uint32_t *)(lVar21 + 0x40) = uVar2;
                        if ((*(uint *)(lVar21 + 0x40) & 0x10) == 0) {
                          *(undefined4 *)(lVar21 + 0x40) = 0x8000;
                        }
                        else {
                          *(undefined4 *)(lVar21 + 0x40) = 0x4049;
                        }
                        *(uint *)(lVar21 + 0x40) = *(uint *)(lVar21 + 0x40) | 0x1a4;
                      }
                      else {
                        if (2 < uVar19 - 3) {
                          archive_set_error(in_RDI,0x54,
                                            "Unknown file attributes from RAR file\'s host OS");
                          return -0x1e;
                        }
                        uVar2 = archive_le32dec(&stack0xffffffffffffffb5);
                        *(uint32_t *)(lVar21 + 0x40) = uVar2;
                      }
                      *(undefined8 *)(lVar21 + 0x98) = 0;
                      *(undefined8 *)(lVar21 + 0xa8) = 0;
                      *(undefined8 *)(lVar21 + 0xb0) = 0;
                      *(undefined8 *)(lVar21 + 0x330) = 0;
                      *(undefined8 *)(lVar21 + 0xc0) = 0;
                      *(undefined4 *)(lVar21 + 0xe0) = 0;
                      *(undefined8 *)(lVar21 + 0xb8) = 0;
                      *(undefined4 *)(lVar21 + 0x4ed0) = 0;
                      *(undefined8 *)(lVar21 + 0x4ed8) = 0;
                      *(undefined8 *)(lVar21 + 0xe8) = 0;
                      *(undefined1 *)(lVar21 + 0xe5) = 0;
                      *(undefined1 *)(lVar21 + 200) = 1;
                      *(undefined1 *)(lVar21 + 0x36b) = 0;
                      *(undefined1 *)(lVar21 + 0x368) = 1;
                      free(*(void **)(lVar21 + 0xd8));
                      *(undefined8 *)(lVar21 + 0xd8) = 0;
                      *(undefined4 *)(lVar21 + 0xcc) = 0;
                      *(undefined4 *)(lVar21 + 0xd0) = 0x20000;
                      memset((void *)(lVar21 + 0x188),0,0x194);
                      Ppmd7_Free((CPpmd7 *)CONCAT44(in_stack_fffffffffffffef4,uVar19),
                                 (ISzAlloc *)in_stack_fffffffffffffee8);
                      *(undefined1 *)(lVar21 + 0x36a) = 0;
                      *(undefined1 *)(lVar21 + 0x369) = 0;
                      if (in_DL == 'z') {
                        local_4 = 0;
                      }
                      else {
                        archive_entry_set_mtime
                                  (in_RSI,*(time_t *)(lVar21 + 0x30),*(long *)(lVar21 + 0x38));
                        archive_entry_set_ctime
                                  (in_RSI,*(time_t *)(lVar21 + 0x78),*(long *)(lVar21 + 0x80));
                        archive_entry_set_atime
                                  (in_RSI,*(time_t *)(lVar21 + 0x68),*(long *)(lVar21 + 0x70));
                        archive_entry_set_size(in_RSI,*(int64_t *)(lVar21 + 0x28));
                        archive_entry_set_mode(in_RSI,*(mode_t *)(lVar21 + 0x40));
                        wVar4 = _archive_entry_copy_pathname_l
                                          ((archive_entry *)
                                           CONCAT17(in_stack_ffffffffffffff07,
                                                    in_stack_ffffffffffffff00),
                                           in_stack_fffffffffffffef8,
                                           CONCAT44(in_stack_fffffffffffffef4,uVar19),
                                           in_stack_fffffffffffffee8);
                        if (wVar4 != L'\0') {
                          piVar15 = __errno_location();
                          if (*piVar15 == 0xc) {
                            archive_set_error(in_RDI,0xc,"Can\'t allocate memory for Pathname");
                            return -0x1e;
                          }
                          pcVar16 = archive_string_conversion_charset_name(local_a8);
                          archive_set_error(in_RDI,0x54,
                                            "Pathname cannot be converted from %s to current locale."
                                            ,pcVar16);
                          local_b4 = -0x14;
                        }
                        if ((*(uint *)(lVar21 + 0x40) & 0xf000) == 0xa000) {
                          *(undefined8 *)(lVar21 + 0xa0) = 0;
                          archive_entry_set_size(in_RSI,0);
                          iVar3 = read_symlink_stored((archive_read *)
                                                      CONCAT44(in_stack_ffffffffffffff1c,
                                                               in_stack_ffffffffffffff18),entry_00,
                                                      in_stack_ffffffffffffff08);
                          if (iVar3 < -0x14) {
                            return iVar3;
                          }
                          if (iVar3 < local_b4) {
                            local_b4 = iVar3;
                          }
                        }
                        if (*(long *)(lVar21 + 0xa0) == 0) {
                          *(undefined1 *)(lVar21 + 0xe5) = 1;
                        }
                        local_4 = local_b4;
                      }
                    }
                    else {
                      archive_set_error(in_RDI,0x54,"Invalid header size");
                      local_4 = -0x1e;
                    }
                  }
                }
                else {
                  __archive_read_consume
                            ((archive_read *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (int64_t)in_stack_fffffffffffffee8);
                  *(int *)(lVar21 + 0x100) = *(int *)(lVar21 + 0x100) + 1;
                  if (*(uint *)(lVar21 + 0x104) <= *(uint *)(lVar21 + 0x100)) {
                    *(int *)(lVar21 + 0x104) = *(int *)(lVar21 + 0x104) + 1;
                    pvVar13 = realloc(*(void **)(lVar21 + 0xf8),
                                      (ulong)*(uint *)(lVar21 + 0x104) * 0x18);
                    *(void **)(lVar21 + 0xf8) = pvVar13;
                    if (pvVar13 == (void *)0x0) {
                      archive_set_error(in_RDI,0xc,"Couldn\'t allocate memory.");
                      return -0x1e;
                    }
                    *(ulong *)(*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18) =
                         local_68;
                    *(undefined8 *)
                     (*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 + 8) =
                         0xffffffffffffffff;
                    *(undefined8 *)
                     (*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 + 0x10) =
                         0xffffffffffffffff;
                  }
                  if (*(long *)(*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 +
                               8) < 0) {
                    *(undefined8 *)
                     (*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 + 8) =
                         *(undefined8 *)in_RDI[8].compression_name;
                    *(long *)(*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 +
                             0x10) =
                         *(long *)(*(long *)(lVar21 + 0xf8) +
                                   (ulong)*(uint *)(lVar21 + 0x100) * 0x18 + 8) +
                         *(long *)(lVar21 + 0x20);
                  }
                  local_4 = 0;
                }
              }
            }
          }
          else {
            archive_set_error(in_RDI,0x54,"Header CRC error");
            local_4 = -0x1e;
          }
        }
      }
      else {
        archive_set_error(in_RDI,0x54,"RAR solid archive support unavailable.");
        local_4 = -0x1e;
      }
    }
  }
  return local_4;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      filename[filename_size++] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}